

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

Abc_Time_t * Abc_NtkGetCoRequiredTimes(Abc_Ntk_t *pNtk)

{
  Abc_Time_t *pAVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = pNtk->vCos->nSize;
  pAVar1 = (Abc_Time_t *)calloc((long)iVar3,8);
  if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
    for (lVar4 = 0; lVar4 < iVar3; lVar4 = lVar4 + 1) {
      pAVar2 = Abc_NtkCo(pNtk,(int)lVar4);
      pAVar1[lVar4] = *(Abc_Time_t *)pAVar2->pNtk->pManTime->vReqs->pArray[pAVar2->Id];
      iVar3 = pNtk->vCos->nSize;
    }
  }
  return pAVar1;
}

Assistant:

Abc_Time_t * Abc_NtkGetCoRequiredTimes( Abc_Ntk_t * pNtk )
{
    Abc_Time_t * p;
    Abc_Obj_t * pNode;
    int i;
    p = ABC_CALLOC( Abc_Time_t, Abc_NtkCoNum(pNtk) );
    if ( pNtk->pManTime == NULL )
        return p;
    // set the PO required times
    Abc_NtkForEachCo( pNtk, pNode, i )
        p[i] = *Abc_NodeRequired(pNode);
    return p;
}